

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lyplg_ext_pfree_instance_substatements(ly_ctx *ctx,lysp_ext_substmt *substmts)

{
  ushort uVar1;
  ly_stmt lVar2;
  lysp_node *plVar3;
  void **ppvVar4;
  ulong uVar5;
  uint64_t c__;
  ulong uVar6;
  void *pvVar7;
  uint64_t c___2;
  lysp_node *node;
  long lVar8;
  void **ppvVar9;
  lysp_ext_substmt *plVar10;
  lysf_ctx fctx;
  lysf_ctx local_58;
  ly_ctx *local_38;
  
  local_58.mod = (lys_module *)0x0;
  local_58.ext_set.size = 0;
  local_58.ext_set.count = 0;
  local_58.ext_set.field_2.dnodes = (lyd_node **)0x0;
  ppvVar9 = (void **)0x0;
  local_58.ctx = ctx;
  local_38 = ctx;
  do {
    if (substmts == (lysp_ext_substmt *)0x0) {
      ppvVar4 = (void **)0x0;
    }
    else {
      ppvVar4 = substmts[-1].storage_p;
    }
    if (ppvVar4 <= ppvVar9) {
      if (substmts != (lysp_ext_substmt *)0x0) {
        free(&substmts[-1].storage_p);
      }
      return;
    }
    ppvVar4 = substmts[(long)ppvVar9].storage_p;
    if (ppvVar4 == (void **)0x0) goto LAB_00161362;
    plVar10 = substmts + (long)ppvVar9;
    lVar2 = plVar10->stmt;
    if ((int)lVar2 < 0x130000) {
      if ((int)lVar2 < 0x20000) {
        if ((int)lVar2 < 0x100) {
          if (((lVar2 - LY_STMT_NOTIFICATION < 0x40) &&
              ((0x800000008000808bU >> ((ulong)(lVar2 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0)) ||
             (lVar2 == LY_STMT_AUGMENT)) goto LAB_00160cb3;
        }
        else if ((int)lVar2 < 0x1000) {
          if ((int)lVar2 < 0x400) {
            if ((lVar2 == LY_STMT_CASE) || (lVar2 == LY_STMT_CHOICE)) goto LAB_00160cb3;
          }
          else if ((lVar2 == LY_STMT_CONTAINER) || (lVar2 == LY_STMT_GROUPING)) goto LAB_00160cb3;
        }
        else if ((int)lVar2 < 0x4000) {
          if ((lVar2 == LY_STMT_LEAF) || (lVar2 == LY_STMT_LEAF_LIST)) goto LAB_00160cb3;
        }
        else {
          if ((lVar2 == LY_STMT_LIST) || (lVar2 == LY_STMT_USES)) {
LAB_00160cb3:
            plVar3 = (lysp_node *)*ppvVar4;
            while (node = plVar3, node != (lysp_node *)0x0) {
              plVar3 = node->next;
              uVar1 = node->nodetype;
              lysp_node_free(&local_58,node);
              if ((uVar1 & 0x3000) != 0) {
                free(node);
              }
            }
            *plVar10->storage_p = (void *)0x0;
            ctx = local_38;
            goto LAB_00161362;
          }
          if (lVar2 == LY_STMT_ARGUMENT) goto LAB_00161118;
        }
      }
      else if ((int)lVar2 < 0xa0000) {
        if ((int)lVar2 < 0x60000) {
          if ((int)lVar2 < 0x40000) {
            if (lVar2 != LY_STMT_BASE) {
              if (lVar2 == LY_STMT_BELONGS_TO) goto LAB_00161118;
              goto LAB_00161147;
            }
            uVar6 = 0;
            while( true ) {
              lVar8 = **plVar10->storage_p;
              if (lVar8 == 0) {
                uVar5 = 0;
              }
              else {
                uVar5 = *(ulong *)(lVar8 + -8);
              }
              if (uVar5 <= uVar6) break;
              lydict_remove(ctx,(char *)(lVar8 + uVar6));
              uVar6 = uVar6 + 1;
            }
            if (lVar8 != 0) {
              free((void *)(lVar8 + -8));
            }
          }
          else if (lVar2 == LY_STMT_BIT) {
LAB_00161129:
            lysp_type_enum_free(&local_58,(lysp_type_enum *)*ppvVar4);
          }
          else if (lVar2 != LY_STMT_CONFIG) goto LAB_00161147;
          goto LAB_00161362;
        }
        if ((int)lVar2 < 0x80000) {
          if (lVar2 == LY_STMT_CONTACT) {
LAB_00161118:
            lydict_remove(ctx,(char *)*ppvVar4);
            goto LAB_00161362;
          }
          if (lVar2 == LY_STMT_DEFAULT) goto LAB_00160f13;
        }
        else {
          if (lVar2 == LY_STMT_DESCRIPTION) goto LAB_00161118;
          if (lVar2 == LY_STMT_DEVIATE) {
            lysp_deviate_free(&local_58,(lysp_deviate *)*ppvVar4);
            goto LAB_00161362;
          }
        }
      }
      else {
        if (0xdffff < (int)lVar2) {
          if ((int)lVar2 < 0x100000) {
            if (lVar2 == LY_STMT_EXTENSION) {
              lysp_ext_free(&local_58,(lysp_ext *)*ppvVar4);
              goto LAB_00161362;
            }
            if (lVar2 != LY_STMT_EXTENSION_INSTANCE) goto LAB_00161147;
            lVar8 = 0;
            uVar6 = 0;
            while( true ) {
              pvVar7 = *plVar10->storage_p;
              if (pvVar7 == (void *)0x0) {
                uVar5 = 0;
              }
              else {
                uVar5 = *(ulong *)((long)pvVar7 + -8);
              }
              if (uVar5 <= uVar6) break;
              lysp_ext_instance_free(&local_58,(lysp_ext_instance *)((long)pvVar7 + lVar8));
              uVar6 = uVar6 + 1;
              lVar8 = lVar8 + 0x70;
            }
          }
          else if (lVar2 == LY_STMT_FEATURE) {
            lVar8 = 0;
            uVar6 = 0;
            while( true ) {
              pvVar7 = *plVar10->storage_p;
              if (pvVar7 == (void *)0x0) {
                uVar5 = 0;
              }
              else {
                uVar5 = *(ulong *)((long)pvVar7 + -8);
              }
              if (uVar5 <= uVar6) break;
              lysp_feature_free(&local_58,(lysp_feature *)((long)pvVar7 + lVar8));
              uVar6 = uVar6 + 1;
              lVar8 = lVar8 + 0x40;
            }
          }
          else {
            if (lVar2 == LY_STMT_FRACTION_DIGITS) goto LAB_00161362;
            if (lVar2 != LY_STMT_IDENTITY) goto LAB_00161147;
            lVar8 = 0;
            uVar6 = 0;
            while( true ) {
              pvVar7 = *plVar10->storage_p;
              if (pvVar7 == (void *)0x0) {
                uVar5 = 0;
              }
              else {
                uVar5 = *(ulong *)((long)pvVar7 + -8);
              }
              if (uVar5 <= uVar6) break;
              lysp_ident_free(&local_58,(lysp_ident *)((long)pvVar7 + lVar8));
              uVar6 = uVar6 + 1;
              lVar8 = lVar8 + 0x38;
            }
          }
          goto LAB_0016134c;
        }
        if ((int)lVar2 < 0xc0000) {
          if (lVar2 == LY_STMT_DEVIATION) {
            lysp_deviation_free(&local_58,(lysp_deviation *)*ppvVar4);
            goto LAB_00161362;
          }
          if (lVar2 == LY_STMT_ENUM) goto LAB_00161129;
        }
        else if ((lVar2 == LY_STMT_ERROR_APP_TAG) || (lVar2 == LY_STMT_ERROR_MESSAGE))
        goto LAB_00161118;
      }
LAB_00161147:
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
             ,0x602);
    }
    else {
      if ((int)lVar2 < 0x240000) {
        if ((int)lVar2 < 0x1b0000) {
          if (0x16ffff < (int)lVar2) {
            if ((int)lVar2 < 0x190000) {
              if (lVar2 == LY_STMT_LENGTH) goto LAB_00161029;
              if (lVar2 != LY_STMT_MANDATORY) goto LAB_00161147;
            }
            else if ((lVar2 != LY_STMT_MAX_ELEMENTS) && (lVar2 != LY_STMT_MIN_ELEMENTS))
            goto LAB_00161147;
            goto LAB_00161362;
          }
          if ((int)lVar2 < 0x150000) {
            if (lVar2 == LY_STMT_IF_FEATURE) {
LAB_00160f13:
              lVar8 = 0;
              uVar6 = 0;
              while( true ) {
                pvVar7 = *plVar10->storage_p;
                if (pvVar7 == (void *)0x0) {
                  uVar5 = 0;
                }
                else {
                  uVar5 = *(ulong *)((long)pvVar7 + -8);
                }
                if (uVar5 <= uVar6) break;
                if (pvVar7 != (void *)0x0) {
                  lydict_remove(ctx,*(char **)((long)pvVar7 + lVar8));
                }
                uVar6 = uVar6 + 1;
                lVar8 = lVar8 + 0x18;
              }
              if (pvVar7 == (void *)0x0) goto LAB_00161362;
LAB_00161358:
              free((void *)((long)pvVar7 + -8));
              goto LAB_00161362;
            }
            if (lVar2 == LY_STMT_IMPORT) {
              lVar8 = 0;
              uVar6 = 0;
              while( true ) {
                pvVar7 = *plVar10->storage_p;
                if (pvVar7 == (void *)0x0) {
                  uVar5 = 0;
                }
                else {
                  uVar5 = *(ulong *)((long)pvVar7 + -8);
                }
                if (uVar5 <= uVar6) break;
                lysp_import_free(&local_58,(lysp_import *)((long)pvVar7 + lVar8));
                uVar6 = uVar6 + 1;
                lVar8 = lVar8 + 0x40;
              }
              goto LAB_0016134c;
            }
          }
          else {
            if (lVar2 == LY_STMT_INCLUDE) {
              lVar8 = 0;
              uVar6 = 0;
              while( true ) {
                pvVar7 = *plVar10->storage_p;
                if (pvVar7 == (void *)0x0) {
                  uVar5 = 0;
                }
                else {
                  uVar5 = *(ulong *)((long)pvVar7 + -8);
                }
                if (uVar5 <= uVar6) break;
                lysp_include_free_(&local_58,(lysp_include *)((long)pvVar7 + lVar8),'\x01');
                uVar6 = uVar6 + 1;
                lVar8 = lVar8 + 0x38;
              }
              goto LAB_0016134c;
            }
            if (lVar2 == LY_STMT_KEY) goto LAB_00161118;
          }
        }
        else {
          if (0x1effff < (int)lVar2) {
            if ((int)lVar2 < 0x210000) {
              if (lVar2 != LY_STMT_ORDERED_BY) {
                if (lVar2 == LY_STMT_ORGANIZATION) goto LAB_00161118;
                goto LAB_00161147;
              }
            }
            else if (lVar2 == LY_STMT_PATH) {
              lyxp_expr_free(ctx,(lyxp_expr *)*ppvVar4);
            }
            else {
              if (lVar2 == LY_STMT_PATTERN) goto LAB_00161029;
              if (lVar2 != LY_STMT_POSITION) goto LAB_00161147;
            }
            goto LAB_00161362;
          }
          if ((int)lVar2 < 0x1d0000) {
            if (lVar2 == LY_STMT_MODIFIER) goto LAB_00161118;
            if (lVar2 == LY_STMT_MODULE) goto LAB_00160ea9;
          }
          else {
            if (lVar2 == LY_STMT_MUST) {
LAB_00161029:
              lVar8 = 0;
              uVar6 = 0;
              while( true ) {
                pvVar7 = *plVar10->storage_p;
                if (pvVar7 == (void *)0x0) {
                  uVar5 = 0;
                }
                else {
                  uVar5 = *(ulong *)((long)pvVar7 + -8);
                }
                if (uVar5 <= uVar6) break;
                lysp_restr_free(&local_58,(lysp_restr *)((long)pvVar7 + lVar8));
                uVar6 = uVar6 + 1;
                lVar8 = lVar8 + 0x40;
              }
              goto LAB_0016134c;
            }
            if (lVar2 == LY_STMT_NAMESPACE) goto LAB_00161118;
          }
        }
        goto LAB_00161147;
      }
      if (0x2cffff < (int)lVar2) {
        if ((int)lVar2 < 0x310000) {
          if (0x2effff < (int)lVar2) {
            if (lVar2 == LY_STMT_TYPEDEF) {
              lVar8 = 0;
              uVar6 = 0;
              while( true ) {
                pvVar7 = *plVar10->storage_p;
                if (pvVar7 == (void *)0x0) {
                  uVar5 = 0;
                }
                else {
                  uVar5 = *(ulong *)((long)pvVar7 + -8);
                }
                if (uVar5 <= uVar6) break;
                lysp_tpdf_free(&local_58,(lysp_tpdf *)((long)pvVar7 + lVar8));
                uVar6 = uVar6 + 1;
                lVar8 = lVar8 + 0xb0;
              }
              goto LAB_0016134c;
            }
            if (lVar2 == LY_STMT_UNIQUE) goto LAB_00160f13;
            goto LAB_00161147;
          }
          if (lVar2 == LY_STMT_SUBMODULE) {
LAB_00160ea9:
            lysp_module_free(&local_58,(lysp_module *)*ppvVar4);
          }
          else {
            if (lVar2 != LY_STMT_TYPE) goto LAB_00161147;
            lysp_type_free(&local_58,(lysp_type *)*ppvVar4);
            free(*ppvVar4);
          }
        }
        else if ((int)lVar2 < 0x330000) {
          if (lVar2 == LY_STMT_UNITS) goto LAB_00161118;
          if (lVar2 != LY_STMT_VALUE) goto LAB_00161147;
        }
        else {
          if (lVar2 == LY_STMT_WHEN) {
            lVar8 = 0;
            uVar6 = 0;
            while( true ) {
              pvVar7 = *plVar10->storage_p;
              if (pvVar7 == (void *)0x0) {
                uVar5 = 0;
              }
              else {
                uVar5 = *(ulong *)((long)pvVar7 + -8);
              }
              if (uVar5 <= uVar6) break;
              lysp_when_free(&local_58,(lysp_when *)((long)pvVar7 + lVar8));
              uVar6 = uVar6 + 1;
              lVar8 = lVar8 + 0x20;
            }
            goto LAB_0016134c;
          }
          if ((lVar2 != LY_STMT_YANG_VERSION) && (lVar2 != LY_STMT_YIN_ELEMENT)) goto LAB_00161147;
        }
        goto LAB_00161362;
      }
      if ((int)lVar2 < 0x280000) {
        if ((int)lVar2 < 0x260000) {
          if ((lVar2 == LY_STMT_PREFIX) || (lVar2 == LY_STMT_PRESENCE)) goto LAB_00161118;
        }
        else {
          if (lVar2 == LY_STMT_RANGE) goto LAB_00161029;
          if (lVar2 == LY_STMT_REFERENCE) goto LAB_00161118;
        }
        goto LAB_00161147;
      }
      if ((int)lVar2 < 0x2a0000) {
        if (lVar2 == LY_STMT_REFINE) {
          lVar8 = 0;
          uVar6 = 0;
          while( true ) {
            pvVar7 = *plVar10->storage_p;
            if (pvVar7 == (void *)0x0) {
              uVar5 = 0;
            }
            else {
              uVar5 = *(ulong *)((long)pvVar7 + -8);
            }
            if (uVar5 <= uVar6) break;
            lysp_refine_free(&local_58,(lysp_refine *)((long)pvVar7 + lVar8));
            uVar6 = uVar6 + 1;
            lVar8 = lVar8 + 0x50;
          }
          goto LAB_0016134c;
        }
        if (lVar2 != LY_STMT_REQUIRE_INSTANCE) goto LAB_00161147;
      }
      else if (lVar2 == LY_STMT_REVISION) {
        lVar8 = 0;
        uVar6 = 0;
        while( true ) {
          pvVar7 = *plVar10->storage_p;
          if (pvVar7 == (void *)0x0) {
            uVar5 = 0;
          }
          else {
            uVar5 = *(ulong *)((long)pvVar7 + -8);
          }
          if (uVar5 <= uVar6) break;
          lysp_revision_free(&local_58,(lysp_revision *)((long)pvVar7 + lVar8));
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x28;
        }
LAB_0016134c:
        if (pvVar7 != (void *)0x0) goto LAB_00161358;
      }
      else {
        if (lVar2 == LY_STMT_REVISION_DATE) goto LAB_00161118;
        if (lVar2 != LY_STMT_STATUS) goto LAB_00161147;
      }
    }
LAB_00161362:
    ppvVar9 = (void **)((long)ppvVar9 + 1);
  } while( true );
}

Assistant:

LIBYANG_API_DEF void
lyplg_ext_pfree_instance_substatements(const struct ly_ctx *ctx, struct lysp_ext_substmt *substmts)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};
    ly_bool node_free;

    LY_ARRAY_FOR(substmts, u) {
        if (!substmts[u].storage_p) {
            continue;
        }

        switch (substmts[u].stmt) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
        case LY_STMT_ACTION:
        case LY_STMT_RPC:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_AUGMENT:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_GROUPING:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST:
        case LY_STMT_USES: {
            struct lysp_node *child, *child_next;

            LY_LIST_FOR_SAFE(*substmts[u].storage_p, child_next, child) {
                node_free = (child->nodetype & (LYS_INPUT | LYS_OUTPUT)) ? 1 : 0;
                lysp_node_free(&fctx, child);
                if (node_free) {
                    free(child);
                }
            }
            *substmts[u].storage_p = NULL;
            break;
        }
        case LY_STMT_BASE:
            /* multiple strings */
            FREE_ARRAY(ctx, **(const char ***)substmts[u].storage_p, lydict_remove);
            break;

        case LY_STMT_BIT:
        case LY_STMT_ENUM:
            /* single enum */
            lysp_type_enum_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_DEVIATE:
            /* single deviate */
            lysp_deviate_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_DEVIATION:
            /* single deviation */
            lysp_deviation_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_EXTENSION:
            /* single extension */
            lysp_ext_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_EXTENSION_INSTANCE:
            /* multiple extension instances */
            FREE_ARRAY(&fctx, *(struct lysp_ext_instance **)substmts[u].storage_p, lysp_ext_instance_free);
            break;

        case LY_STMT_FEATURE:
            /* multiple features */
            FREE_ARRAY(&fctx, *(struct lysp_feature **)substmts[u].storage_p, lysp_feature_free);
            break;

        case LY_STMT_IDENTITY:
            /* multiple identities */
            FREE_ARRAY(&fctx, *(struct lysp_ident **)substmts[u].storage_p, lysp_ident_free);
            break;

        case LY_STMT_IMPORT:
            /* multiple imports */
            FREE_ARRAY(&fctx, *(struct lysp_import **)substmts[u].storage_p, lysp_import_free);
            break;

        case LY_STMT_INCLUDE:
            /* multiple includes */
            FREE_ARRAY(&fctx, *(struct lysp_include **)substmts[u].storage_p, lysp_include_free);
            break;

        case LY_STMT_REFINE:
            /* multiple refines */
            FREE_ARRAY(&fctx, *(struct lysp_refine **)substmts[u].storage_p, lysp_refine_free);
            break;

        case LY_STMT_REVISION:
            /* multiple revisions */
            FREE_ARRAY(&fctx, *(struct lysp_revision **)substmts[u].storage_p, lysp_revision_free);
            break;

        case LY_STMT_CONFIG:
        case LY_STMT_FRACTION_DIGITS:
        case LY_STMT_MANDATORY:
        case LY_STMT_MAX_ELEMENTS:
        case LY_STMT_MIN_ELEMENTS:
        case LY_STMT_ORDERED_BY:
        case LY_STMT_POSITION:
        case LY_STMT_REQUIRE_INSTANCE:
        case LY_STMT_STATUS:
        case LY_STMT_VALUE:
        case LY_STMT_YANG_VERSION:
        case LY_STMT_YIN_ELEMENT:
            /* nothing to do */
            break;

        case LY_STMT_ARGUMENT:
        case LY_STMT_BELONGS_TO:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_ERROR_APP_TAG:
        case LY_STMT_ERROR_MESSAGE:
        case LY_STMT_KEY:
        case LY_STMT_MODIFIER:
        case LY_STMT_NAMESPACE:
        case LY_STMT_ORGANIZATION:
        case LY_STMT_PREFIX:
        case LY_STMT_PRESENCE:
        case LY_STMT_REFERENCE:
        case LY_STMT_REVISION_DATE:
        case LY_STMT_UNITS:
            /* single string */
            lydict_remove(ctx, *substmts[u].storage_p);
            break;

        case LY_STMT_LENGTH:
        case LY_STMT_MUST:
        case LY_STMT_PATTERN:
        case LY_STMT_RANGE:
            /* multiple restrictions */
            FREE_ARRAY(&fctx, *(struct lysp_restr **)substmts[u].storage_p, lysp_restr_free);
            break;

        case LY_STMT_WHEN:
            /* multiple whens */
            FREE_ARRAY(&fctx, *(struct lysp_when **)substmts[u].storage_p, lysp_when_free);
            break;

        case LY_STMT_PATH:
            /* single expression */
            lyxp_expr_free(ctx, *substmts[u].storage_p);
            break;

        case LY_STMT_DEFAULT:
        case LY_STMT_IF_FEATURE:
        case LY_STMT_UNIQUE:
            /* multiple qnames */
            FREE_ARRAY(ctx, *(struct lysp_qname **)substmts[u].storage_p, lysp_qname_free);
            break;

        case LY_STMT_TYPEDEF:
            /* multiple typedefs */
            FREE_ARRAY(&fctx, *(struct lysp_tpdf **)substmts[u].storage_p, lysp_tpdf_free);
            break;

        case LY_STMT_TYPE: {
            /* single type */
            struct lysp_type **type_p = (struct lysp_type **)substmts[u].storage_p;

            lysp_type_free(&fctx, *type_p);
            free(*type_p);
            break;
        }
        case LY_STMT_MODULE:
        case LY_STMT_SUBMODULE:
            /* single (sub)module */
            lysp_module_free(&fctx, *substmts[u].storage_p);
            break;

        default:
            LOGINT(ctx);
        }
    }

    LY_ARRAY_FREE(substmts);
}